

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O0

jint Java_beagle_BeagleJNIWrapper_calculateCrossProductDifferentials
               (JNIEnv *env,jobject obj,jint instance,jintArray postBufferIndices,
               jintArray preBufferIndices,jintArray categoryRatesIndices,
               jintArray categoryWeightsIndices,jdoubleArray edgeLengths,jint count,
               jdoubleArray outSumDerivatives,jdoubleArray outSumSquaredDerivatives)

{
  jint jVar1;
  jint *pjVar2;
  jint *pjVar3;
  jint *pjVar4;
  jint *pjVar5;
  jdouble *pjVar6;
  undefined4 in_EDX;
  undefined4 in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  jint errCode;
  jdouble *jEdgeLengths;
  jint *jCategoryWeightsIndices;
  jint *jCategoryRatesIndices;
  jint *jPreBufferIndices;
  jint *jPostBufferIndices;
  jdouble *jOutSumSquaredDerivatives;
  jdouble *jOutSumDerivatives;
  undefined4 in_stack_ffffffffffffff68;
  jint in_stack_ffffffffffffff6c;
  JNIEnv_ *in_stack_ffffffffffffff70;
  jintArray array;
  jintArray this;
  undefined8 local_78;
  
  if (in_stack_00000020 == 0) {
    local_78 = (jdouble *)0x0;
  }
  else {
    local_78 = JNIEnv_::GetDoubleArrayElements
                         (in_stack_ffffffffffffff70,
                          (jdoubleArray)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (jboolean *)0x104a61);
  }
  if (in_stack_00000028 == 0) {
    array = (jintArray)0x0;
  }
  else {
    array = (jintArray)
            JNIEnv_::GetDoubleArrayElements
                      (in_stack_ffffffffffffff70,
                       (jdoubleArray)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       (jboolean *)0x104a9d);
  }
  this = array;
  pjVar2 = JNIEnv_::GetIntArrayElements
                     (in_stack_ffffffffffffff70,
                      (jintArray)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (jboolean *)0x104ac2);
  pjVar3 = JNIEnv_::GetIntArrayElements
                     (in_stack_ffffffffffffff70,
                      (jintArray)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (jboolean *)0x104add);
  pjVar4 = JNIEnv_::GetIntArrayElements
                     (in_stack_ffffffffffffff70,
                      (jintArray)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (jboolean *)0x104af8);
  pjVar5 = JNIEnv_::GetIntArrayElements
                     (in_stack_ffffffffffffff70,
                      (jintArray)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (jboolean *)0x104b16);
  pjVar6 = JNIEnv_::GetDoubleArrayElements
                     (in_stack_ffffffffffffff70,
                      (jdoubleArray)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (jboolean *)0x104b34);
  jVar1 = beagleCalculateCrossProductDerivative
                    (in_EDX,pjVar2,pjVar3,pjVar4,pjVar5,pjVar6,in_stack_00000018);
  JNIEnv_::ReleaseIntArrayElements((JNIEnv_ *)this,array,(jint *)local_78,in_stack_ffffffffffffff6c)
  ;
  JNIEnv_::ReleaseIntArrayElements((JNIEnv_ *)this,array,(jint *)local_78,in_stack_ffffffffffffff6c)
  ;
  JNIEnv_::ReleaseIntArrayElements((JNIEnv_ *)this,array,(jint *)local_78,in_stack_ffffffffffffff6c)
  ;
  JNIEnv_::ReleaseIntArrayElements((JNIEnv_ *)this,array,(jint *)local_78,in_stack_ffffffffffffff6c)
  ;
  JNIEnv_::ReleaseDoubleArrayElements
            ((JNIEnv_ *)this,(jdoubleArray)array,local_78,in_stack_ffffffffffffff6c);
  if (in_stack_00000020 != 0) {
    JNIEnv_::ReleaseDoubleArrayElements
              ((JNIEnv_ *)this,(jdoubleArray)array,local_78,in_stack_ffffffffffffff6c);
  }
  if (in_stack_00000028 != 0) {
    JNIEnv_::ReleaseDoubleArrayElements
              ((JNIEnv_ *)this,(jdoubleArray)array,local_78,in_stack_ffffffffffffff6c);
  }
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_calculateCrossProductDifferentials
  (JNIEnv *env, jobject obj, jint instance,
		jintArray postBufferIndices,
		jintArray preBufferIndices,
		jintArray categoryRatesIndices,
		jintArray categoryWeightsIndices,
		jdoubleArray edgeLengths,
		jint count,
		jdoubleArray outSumDerivatives,
		jdoubleArray outSumSquaredDerivatives) {

    jdouble* jOutSumDerivatives = outSumDerivatives == NULL ?
            NULL : env->GetDoubleArrayElements(outSumDerivatives, NULL);

    jdouble* jOutSumSquaredDerivatives = outSumSquaredDerivatives == NULL ?
            NULL : env->GetDoubleArrayElements(outSumSquaredDerivatives, NULL);

    jint *jPostBufferIndices = env->GetIntArrayElements(postBufferIndices, NULL);
    jint *jPreBufferIndices  = env->GetIntArrayElements(preBufferIndices, NULL);

    jint *jCategoryRatesIndices = env->GetIntArrayElements(categoryRatesIndices, NULL);
    jint *jCategoryWeightsIndices = env->GetIntArrayElements(categoryWeightsIndices, NULL);

    jdouble* jEdgeLengths = env->GetDoubleArrayElements(edgeLengths, NULL);

    jint errCode = beagleCalculateCrossProductDerivative(instance, (int*)jPostBufferIndices, (int*)jPreBufferIndices,
                                                         (int*)jCategoryRatesIndices, (int*)jCategoryWeightsIndices,
                                                         (double*)jEdgeLengths, count,
                                                         jOutSumDerivatives, jOutSumSquaredDerivatives);

    env->ReleaseIntArrayElements(postBufferIndices, jPostBufferIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(preBufferIndices, jPreBufferIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(categoryRatesIndices, jCategoryRatesIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(categoryWeightsIndices, jCategoryWeightsIndices, JNI_ABORT);
    env->ReleaseDoubleArrayElements(edgeLengths, jEdgeLengths, JNI_ABORT);

    if (outSumDerivatives != NULL) {
        env->ReleaseDoubleArrayElements(outSumDerivatives, jOutSumDerivatives, 0);
    }

    if (outSumSquaredDerivatives != NULL) {
        env->ReleaseDoubleArrayElements(outSumSquaredDerivatives, jOutSumSquaredDerivatives, 0);
    }

    return errCode;


}